

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

double nullcGetResultDouble(void)

{
  double dVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      dVar1 = ExecutorRegVm::GetResultDouble(NULLC::executorRegVm);
      return dVar1;
    }
    if (NULLC::currExec == 1) {
      dVar1 = ExecutorX86::GetResultDouble(NULLC::executorX86);
      return dVar1;
    }
  }
  return 0.0;
}

Assistant:

double nullcGetResultDouble()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0.0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultDouble();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultDouble();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultDouble();
#endif

	return 0.0;
}